

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O3

int __thiscall
SslUdpSocketImpl::DatenDecode
          (SslUdpSocketImpl *this,uint8_t *buffer,size_t nAnzahl,string *strAddress)

{
  mutex *pmVar1;
  atomic<unsigned_long> *paVar2;
  SslConnection *this_00;
  BaseSocket *pBVar3;
  _Alloc_hider __n;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *szBuffer;
  UdpSocket *__args;
  uint8_t *szBuffer_00;
  pointer szBuffer_01;
  SSL *pSVar8;
  wstring *pwVar9;
  bool bVar10;
  unsigned_long __n2;
  unique_lock<std::mutex> lock1_1;
  size_t len;
  unique_lock<std::mutex> lock1;
  size_t anz;
  int iErrorHint;
  unique_lock<std::mutex> lock;
  undefined1 local_180 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_170;
  uint local_15c;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_158;
  string *local_138;
  size_t local_130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_128;
  _Head_base<0UL,_unsigned_char_*,_false> local_108;
  size_t local_100;
  unique_lock<std::mutex> local_f8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e8;
  uint8_t *local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c0;
  unique_lock<std::mutex> local_a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  if (nAnzahl == 0 || buffer == (uint8_t *)0x0) {
    return 0;
  }
  local_108._M_head_impl = (uchar *)&this->m_mxEnDecode;
  local_a0._M_owns = false;
  local_138 = strAddress;
  local_130 = nAnzahl;
  local_a0._M_device = (mutex_type *)local_108._M_head_impl;
  std::unique_lock<std::mutex>::lock(&local_a0);
  sVar7 = local_130;
  local_a0._M_owns = true;
  local_c8 = buffer;
  local_100 = OpenSSLWrapper::SslConnection::SslPutInData
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                         ,buffer,local_130);
  std::unique_lock<std::mutex>::unlock(&local_a0);
  iVar6 = -1;
  if (this->m_bCloseReq == false) {
    iVar4 = OpenSSLWrapper::SslConnection::SSLGetShutdown
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    this_00 = (this->m_pSslCon)._M_t.
              super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              ._M_t.
              super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
              .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
    if (iVar4 < 2) {
      uVar5 = OpenSSLWrapper::SslConnection::SslInitFinished(this_00);
      if (uVar5 == 0) {
        local_15c = OpenSSLWrapper::SslConnection::SSLDoHandshake
                              ((this->m_pSslCon)._M_t.
                               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                               _M_head_impl);
        local_f8._M_device = (mutex_type *)local_108._M_head_impl;
        local_f8._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_f8);
        local_f8._M_owns = true;
        sVar7 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        if (sVar7 == 0) {
          bVar10 = false;
        }
        else {
          pmVar1 = &(this->super_UdpSocketImpl).m_mxOutDeque;
          bVar10 = false;
          do {
            szBuffer = (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                        *)operator_new__(sVar7);
            memset(szBuffer,0,sVar7);
            local_180._0_8_ = szBuffer;
            local_158._M_dataplus._M_p =
                 (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,(uint8_t *)&szBuffer->_M_allocated_capacity,sVar7)
            ;
            if (local_158._M_dataplus._M_p != (pointer)0x0) {
              iVar4 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
              if (iVar4 != 0) {
                std::__throw_system_error(iVar4);
              }
              LOCK();
              paVar2 = &(this->super_UdpSocketImpl).m_atOutBytes;
              (paVar2->super___atomic_base<unsigned_long>)._M_i =
                   (__int_type)
                   ((paVar2->super___atomic_base<unsigned_long>)._M_i +
                   (long)local_158._M_dataplus._M_p);
              UNLOCK();
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
              ::
              emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                          *)&(this->super_UdpSocketImpl).m_quOutData,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         local_180,(unsigned_long *)&local_158,local_138);
              pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
              bVar10 = true;
            }
            sVar7 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                              ((this->m_pSslCon)._M_t.
                               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                               _M_head_impl);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_180._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)0x0) {
              operator_delete__((void *)local_180._0_8_);
            }
          } while (sVar7 != 0);
        }
        std::unique_lock<std::mutex>::unlock(&local_f8);
        if (bVar10) {
          UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
        }
        if ((int)local_15c < 1) {
          uVar5 = OpenSSLWrapper::SslConnection::SSLGetError
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl,local_15c);
          if (uVar5 != 2) {
            (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iError = uVar5 | 0x80000000;
            (this->super_UdpSocketImpl).super_BaseSocketImpl.m_iErrLoc = 0xe;
            __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                      (&local_50,vswprintf,0x10,L"%d",(ulong)uVar5);
            std::operator+(&local_c0,L"SSL_error: ",&local_50);
            pwVar9 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_c0);
            std::__cxx11::wstring::wstring((wstring *)&local_e8,pwVar9);
            __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                      (&local_70,vswprintf,0x10,L"%d",(ulong)local_15c);
            std::operator+(&local_128,&local_e8,&local_70);
            pwVar9 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_128);
            std::__cxx11::wstring::wstring((wstring *)&local_158,pwVar9);
            pSVar8 = OpenSSLWrapper::SslConnection::operator()
                               ((this->m_pSslCon)._M_t.
                                super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                _M_head_impl);
            __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                      (&local_90,vswprintf,0x20,L"%lu",pSVar8);
            std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                            *)local_180,&local_158,&local_90);
            OutputDebugString((wchar_t *)local_180._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_180._0_8_ != &local_170) {
              operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,
                              local_90.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,
                              local_158.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              local_128.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,
                              local_70.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,
                              local_e8.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)CONCAT44(local_c0._M_dataplus._M_p._4_4_,local_c0._M_dataplus._M_p._0_4_) !=
                &local_c0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_c0._M_dataplus._M_p._4_4_,
                                       local_c0._M_dataplus._M_p._0_4_),
                              local_c0.field_2._M_allocated_capacity * 4 + 4);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,
                              local_50.field_2._M_allocated_capacity * 4 + 4);
            }
            OpenSSLWrapper::SslConnection::GetSslErrAsString_abi_cxx11_
                      ((string *)&local_158,
                       (this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_180,", msg: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_158);
            OutputDebugStringA((char *)local_180._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_180._0_8_ != &local_170) {
              operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_bStop;
            if (bVar10 == false &&
                (this->super_UdpSocketImpl).super_BaseSocketImpl.m_fErrorParam.super__Function_base.
                _M_manager != (_Manager_type)0x0) {
              std::function<void_(BaseSocket_*,_void_*)>::operator()
                        (&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fErrorParam,
                         (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef,
                         (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pvUserData);
            }
            else if ((this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError.super__Function_base.
                     _M_manager != (_Manager_type)0x0 && bVar10 == false) {
              local_180._0_8_ = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
              (*(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError._M_invoker)
                        ((_Any_data *)&(this->super_UdpSocketImpl).super_BaseSocketImpl.m_fError,
                         (BaseSocket **)local_180);
            }
            std::unique_lock<std::mutex>::~unique_lock(&local_f8);
            goto LAB_0011231c;
          }
        }
        else if ((this->m_fSllInitDoneParam).super__Function_base._M_manager == (_Manager_type)0x0)
        {
          if ((this->m_fSllInitDone).super__Function_base._M_manager != (_Manager_type)0x0) {
            pBVar3 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
            if (pBVar3 == (BaseSocket *)0x0) {
              local_180._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                    *)0x0;
            }
            else {
              local_180._0_8_ = __dynamic_cast(pBVar3,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
            }
            (*(this->m_fSllInitDone)._M_invoker)
                      ((_Any_data *)&this->m_fSllInitDone,(UdpSocket **)local_180);
          }
        }
        else {
          pBVar3 = (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pBkRef;
          if (pBVar3 == (BaseSocket *)0x0) {
            __args = (UdpSocket *)0x0;
          }
          else {
            __args = (UdpSocket *)
                     __dynamic_cast(pBVar3,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
          }
          std::function<void_(UdpSocket_*,_void_*)>::operator()
                    (&this->m_fSllInitDoneParam,__args,
                     (this->super_UdpSocketImpl).super_BaseSocketImpl.m_pvUserData);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_f8);
        sVar7 = local_130;
        uVar5 = local_15c;
      }
      iVar6 = -1;
      if (uVar5 == 1) {
        szBuffer_00 = (uint8_t *)operator_new__(0xffff);
        memset(szBuffer_00,0,0xffff);
        local_c0._M_dataplus._M_p._0_4_ = 0;
        local_158._M_dataplus._M_p =
             (pointer)OpenSSLWrapper::SslConnection::SslRead
                                ((this->m_pSslCon)._M_t.
                                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                 _M_head_impl,szBuffer_00,0xffff,(int *)&local_c0);
        if (local_158._M_dataplus._M_p != (pointer)0x0) {
          pmVar1 = &(this->super_UdpSocketImpl).m_mxInDeque;
          do {
            __n._M_p = local_158._M_dataplus._M_p;
            local_180._0_8_ = operator_new__((ulong)local_158._M_dataplus._M_p);
            memcpy((void *)local_180._0_8_,szBuffer_00,(size_t)__n._M_p);
            iVar6 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
            if (iVar6 != 0) {
              std::__throw_system_error(iVar6);
            }
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                        *)&(this->super_UdpSocketImpl).m_quInData,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       local_180,(unsigned_long *)&local_158,local_138);
            LOCK();
            paVar2 = &(this->super_UdpSocketImpl).m_atInBytes;
            (paVar2->super___atomic_base<unsigned_long>)._M_i =
                 (__int_type)
                 ((paVar2->super___atomic_base<unsigned_long>)._M_i +
                 (long)local_158._M_dataplus._M_p);
            UNLOCK();
            pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
            local_158._M_dataplus._M_p =
                 (pointer)OpenSSLWrapper::SslConnection::SslRead
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,szBuffer_00,0xffff,(int *)&local_c0);
            if ((uchar *)local_180._0_8_ != (uchar *)0x0) {
              operator_delete__((void *)local_180._0_8_);
            }
          } while (local_158._M_dataplus._M_p != (pointer)0x0);
        }
        local_180._0_8_ = local_108._M_head_impl;
        local_180[8] = false;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_180);
        local_180[8] = true;
        sVar7 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        if (sVar7 == 0) {
          bVar10 = false;
        }
        else {
          pmVar1 = &(this->super_UdpSocketImpl).m_mxOutDeque;
          bVar10 = false;
          do {
            szBuffer_01 = (pointer)operator_new__(sVar7);
            memset(szBuffer_01,0,sVar7);
            local_128._M_dataplus._M_p = szBuffer_01;
            local_e8._M_dataplus._M_p =
                 (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                    ((this->m_pSslCon)._M_t.
                                     super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                     .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                     _M_head_impl,(uint8_t *)szBuffer_01,sVar7);
            if (local_e8._M_dataplus._M_p != (pointer)0x0) {
              iVar6 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
              if (iVar6 != 0) {
                std::__throw_system_error(iVar6);
              }
              LOCK();
              paVar2 = &(this->super_UdpSocketImpl).m_atOutBytes;
              (paVar2->super___atomic_base<unsigned_long>)._M_i =
                   (__int_type)
                   ((paVar2->super___atomic_base<unsigned_long>)._M_i +
                   (long)local_e8._M_dataplus._M_p);
              UNLOCK();
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
              ::
              emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                          *)&(this->super_UdpSocketImpl).m_quOutData,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &local_128,(unsigned_long *)&local_e8,local_138);
              pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
              bVar10 = true;
            }
            sVar7 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                              ((this->m_pSslCon)._M_t.
                               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                               _M_head_impl);
            if (local_128._M_dataplus._M_p != (pointer)0x0) {
              operator_delete__(local_128._M_dataplus._M_p);
            }
          } while (sVar7 != 0);
        }
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_180);
        if (bVar10) {
          UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
        }
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_180);
        operator_delete__(szBuffer_00);
        iVar6 = 1;
        sVar7 = local_130;
      }
      sVar7 = sVar7 - local_100;
      if (sVar7 != 0 && local_100 != 0) {
        pSVar8 = OpenSSLWrapper::SslConnection::operator()
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl);
        __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                  (&local_128,vswprintf,0x20,L"%lu",pSVar8);
        pwVar9 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)&local_128,0,(wchar_t *)0x0,0x1335bc);
        std::__cxx11::wstring::wstring((wstring *)&local_158,pwVar9);
        pwVar9 = (wstring *)std::__cxx11::wstring::append((wchar_t *)&local_158);
        std::__cxx11::wstring::wstring((wstring *)local_180,pwVar9);
        OutputDebugString((wchar_t *)local_180._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_180._0_8_ != &local_170) {
          operator_delete((void *)local_180._0_8_,local_170._M_allocated_capacity * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        iVar6 = DatenDecode(this,local_c8 + local_100,sVar7,local_138);
      }
    }
    else {
      OpenSSLWrapper::SslConnection::ShutDownConnection(this_00,(int *)0x0);
      (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[2])(this);
    }
  }
LAB_0011231c:
  std::unique_lock<std::mutex>::~unique_lock(&local_a0);
  return iVar6;
}

Assistant:

int SslUdpSocketImpl::DatenDecode(const uint8_t* buffer, size_t nAnzahl, const string& strAddress)
{
    if (buffer == nullptr || nAnzahl == 0)
        return 0;

    unique_lock<mutex> lock(m_mxEnDecode);
    const size_t nPut = m_pSslCon->SslPutInData(buffer, nAnzahl);
    lock.unlock();

    if (m_bCloseReq == true)
        return -1;

    if (m_pSslCon->SSLGetShutdown() >= SSL_RECEIVED_SHUTDOWN)
    {
        m_pSslCon->ShutDownConnection();
        Close();
        return -1;
    }

    int iSslInit = m_pSslCon->SslInitFinished();
    if (iSslInit == 0)
    {
        iSslInit = m_pSslCon->SSLDoHandshake();

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, strAddress);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();

        if (iSslInit <= 0)
        {
            const int iError = m_pSslCon->SSLGetError(iSslInit);
            if (iError != SSL_ERROR_WANT_READ)
            {
                m_iError = 0x80000000 | iError;
                m_iErrLoc = 14;
                OutputDebugString(wstring(L"SSL_error: " + to_wstring(iError) + L", after SSL_do_handshake returned: " + to_wstring(iSslInit) + L" on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)()))).c_str());
                OutputDebugStringA(string(", msg: " + m_pSslCon->GetSslErrAsString()).c_str());
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                return -1;
            }
        }
        else
        {
            if (m_fSllInitDoneParam != nullptr)
                m_fSllInitDoneParam(dynamic_cast<UdpSocket*>(m_pBkRef), m_pvUserData);
            else if (m_fSllInitDone != nullptr)
                m_fSllInitDone(dynamic_cast<UdpSocket*>(m_pBkRef));
        }
    }

    int iReturn = -1;
    if (iSslInit == 1)
    {
        auto Buffer = make_unique<uint8_t[]>(0x0000ffff);
        int iErrorHint = 0;
        size_t len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        while (len > 0)
        {
            auto tmp = make_unique<uint8_t[]>(len);
            copy_n(&Buffer[0], len, &tmp[0]);
            m_mxInDeque.lock();
            m_quInData.emplace_back(move(tmp), len, strAddress);
            m_atInBytes += len;
            m_mxInDeque.unlock();

            len = m_pSslCon->SslRead(&Buffer[0], 0x0000ffff, &iErrorHint); // get receive data from the SSL layer, and put it into the unencrypted receive Que
        }
        iReturn = 1;

        bool bNewData = false;
        unique_lock<mutex> lock1(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t anz = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (anz > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += anz;
                m_quOutData.emplace_back(move(temp), anz, strAddress);
                m_mxOutDeque.unlock();
                bNewData = true;
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock1.unlock();

        if (bNewData == true)
            TriggerWriteThread();
    }

    if (nPut != 0 && nPut != nAnzahl)
    {
        OutputDebugString(wstring(L"SslPutInData konnte nicht alles fassen on ssl context: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
        return DatenDecode(&buffer[nPut], nAnzahl - nPut, strAddress);
    }

    return iReturn;
}